

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O2

string * nivalis::nivalis_to_latex_safe(string *__return_storage_ptr__,string *expr_in)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  allocator_type *paVar3;
  long lVar4;
  long *in_FS_OFFSET;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view src_02;
  string_view src_03;
  string_view src_04;
  string_view src_05;
  string_view src_06;
  string_view src_07;
  initializer_list<char> __l;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_00;
  initializer_list<char> __l_01;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_02;
  initializer_list<char> __l_03;
  initializer_list<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem> __l_04;
  string_view to;
  string_view to_00;
  string_view to_01;
  string_view to_02;
  string_view to_03;
  string_view to_04;
  string_view to_05;
  string_view to_06;
  string_view to_07;
  allocator_type local_211;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  ParenRuleOutputItem local_1d0;
  undefined4 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  ParenRuleOutputItem local_180;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&expr,(string *)expr_in);
  util::trim((util *)&expr,expr_in);
  sVar2 = expr._M_string_length;
  _Var1 = expr._M_dataplus;
  if (expr._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1d0);
  }
  else if (*expr._M_dataplus._M_p == '#') {
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&expr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                   "\\text{",&local_1f0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                   "}");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"*",(allocator<char> *)&local_1f0);
    src._M_str = _Var1._M_p;
    src._M_len = sVar2;
    to._M_str = "\\cdot ";
    to._M_len = 6;
    util::str_replace((string *)&local_1d0,src,&local_38,to);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_38);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"<=",(allocator<char> *)&local_1f0);
    src_00._M_str = _Var1._M_p;
    src_00._M_len = sVar2;
    to_00._M_str = "\\le ";
    to_00._M_len = 4;
    util::str_replace((string *)&local_1d0,src_00,&local_58,to_00);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_58);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,">=",(allocator<char> *)&local_1f0);
    src_01._M_str = _Var1._M_p;
    src_01._M_len = sVar2;
    to_01._M_str = "\\ge ";
    to_01._M_len = 4;
    util::str_replace((string *)&local_1d0,src_01,&local_78,to_01);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_78);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"!=",(allocator<char> *)&local_1f0);
    src_02._M_str = _Var1._M_p;
    src_02._M_len = sVar2;
    to_02._M_str = "\\ne ";
    to_02._M_len = 4;
    util::str_replace((string *)&local_1d0,src_02,&local_98,to_02);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_98);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"&",(allocator<char> *)&local_1f0);
    src_03._M_str = _Var1._M_p;
    src_03._M_len = sVar2;
    to_03._M_str = "\\wedge ";
    to_03._M_len = 7;
    util::str_replace((string *)&local_1d0,src_03,&local_b8,to_03);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_b8);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"|",(allocator<char> *)&local_1f0);
    src_04._M_str = _Var1._M_p;
    src_04._M_len = sVar2;
    to_04._M_str = "\\vee ";
    to_04._M_len = 5;
    util::str_replace((string *)&local_1d0,src_04,&local_d8,to_04);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_d8);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"{",(allocator<char> *)&local_1f0);
    src_05._M_str = _Var1._M_p;
    src_05._M_len = sVar2;
    to_05._M_str = "\\left\\{";
    to_05._M_len = 7;
    util::str_replace((string *)&local_1d0,src_05,&local_f8,to_05);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_f8);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"}",(allocator<char> *)&local_1f0);
    src_06._M_str = _Var1._M_p;
    src_06._M_len = sVar2;
    to_06._M_str = "\\right\\}";
    to_06._M_len = 8;
    util::str_replace((string *)&local_1d0,src_06,&local_118,to_06);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_118);
    sVar2 = expr._M_string_length;
    _Var1 = expr._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"@",(allocator<char> *)&local_1f0);
    src_07._M_str = _Var1._M_p;
    src_07._M_len = sVar2;
    to_07._M_str = "\\operatorname{at} ";
    to_07._M_len = 0x12;
    util::str_replace((string *)&local_1d0,src_07,&local_138,to_07);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_138);
    if ((char)in_FS_OFFSET[-0x24] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(*in_FS_OFFSET + -0x170),"sqrt",(allocator<char> *)&local_1f0);
      local_158._M_dataplus._M_p._0_1_ = 0x28;
      paVar3 = &local_211;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_158;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0x150),__l,paVar3);
      anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_1d0,"\\sqrt{");
      local_1a0 = local_190;
      local_1a8 = 0;
      local_198 = 0;
      local_190[0] = 0;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_180,"}");
      __l_00._M_len = 3;
      __l_00._M_array = &local_1d0;
      std::
      vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
      ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                *)(*in_FS_OFFSET + -0x138),__l_00,(allocator_type *)paVar3);
      lVar4 = 0x58;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1d0.idx + lVar4));
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != -0x20);
      __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x170,&__dso_handle
                         );
      *(undefined1 *)(in_FS_OFFSET + -0x24) = 1;
    }
    if ((char)in_FS_OFFSET[-0x19] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(*in_FS_OFFSET + -0x118),"abs",(allocator<char> *)&local_1f0);
      local_158._M_dataplus._M_p._0_1_ = 0x28;
      paVar3 = &local_211;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_158;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0xf8),__l_01,paVar3);
      anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_1d0,"\\left|");
      local_1a0 = local_190;
      local_1a8 = 0;
      local_198 = 0;
      local_190[0] = 0;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_180,"\\right|");
      __l_02._M_len = 3;
      __l_02._M_array = &local_1d0;
      std::
      vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
      ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                *)(*in_FS_OFFSET + -0xe0),__l_02,(allocator_type *)paVar3);
      lVar4 = 0x58;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1d0.idx + lVar4));
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != -0x20);
      __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0x118,&__dso_handle
                         );
      *(undefined1 *)(in_FS_OFFSET + -0x19) = 1;
    }
    if ((char)in_FS_OFFSET[-0xe] == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(*in_FS_OFFSET + -0xc0),"diff",(allocator<char> *)&local_1f0);
      local_158._M_dataplus._M_p._0_1_ = 0x28;
      paVar3 = &local_211;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&local_158;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)(*in_FS_OFFSET + -0xa0),__l_03,paVar3);
      anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_1d0,"\\frac{d}{d");
      local_1a0 = local_190;
      local_1a8 = 0;
      local_198 = 0;
      local_190[0] = 0;
      anon_unknown_1::ParenRule::ParenRuleOutputItem::ParenRuleOutputItem(&local_180,"}");
      __l_04._M_len = 3;
      __l_04._M_array = &local_1d0;
      std::
      vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
      ::vector((vector<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem,_std::allocator<nivalis::(anonymous_namespace)::ParenRule::ParenRuleOutputItem>_>
                *)(*in_FS_OFFSET + -0x88),__l_04,(allocator_type *)paVar3);
      lVar4 = 0x58;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1d0.idx + lVar4));
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != -0x20);
      __cxa_thread_atexit(anon_unknown_1::ParenRule::~ParenRule,*in_FS_OFFSET + -0xc0,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -0xe) = 1;
    }
    lVar4 = *in_FS_OFFSET;
    anon_unknown_1::ParenRule::operator()(&local_158,(ParenRule *)(lVar4 + -0x170),&expr);
    anon_unknown_1::ParenRule::operator()
              (&local_1f0,(ParenRule *)(*in_FS_OFFSET + -0x118),&local_158);
    anon_unknown_1::ParenRule::operator()
              ((string *)&local_1d0,(ParenRule *)(lVar4 + -0xc0),&local_1f0);
    std::__cxx11::string::operator=((string *)&expr,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_158);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expr._M_dataplus._M_p == &expr.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(expr.field_2._M_allocated_capacity._1_7_,expr.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = expr.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = expr._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(expr.field_2._M_allocated_capacity._1_7_,expr.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = expr._M_string_length;
    expr._M_string_length = 0;
    expr.field_2._M_local_buf[0] = '\0';
    expr._M_dataplus._M_p = (pointer)&expr.field_2;
  }
  std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

std::string nivalis_to_latex_safe(const std::string& expr_in) {
    std::string expr = expr_in;
    util::trim(expr);
    if (expr.empty()) return "";
    if (expr[0] == '#') return "\\text{" + expr.substr(1) + "}";
    expr = util::str_replace(expr, "*", "\\cdot ");
    expr = util::str_replace(expr, "<=", "\\le ");
    expr = util::str_replace(expr, ">=", "\\ge ");
    expr = util::str_replace(expr, "!=", "\\ne ");
    expr = util::str_replace(expr, "&", "\\wedge ");
    expr = util::str_replace(expr, "|", "\\vee ");
    expr = util::str_replace(expr, "{", "\\left\\{");
    expr = util::str_replace(expr, "}", "\\right\\}");
    expr = util::str_replace(expr, "@", "\\operatorname{at} ");

    thread_local ParenRule
        n2l_sqrt { "sqrt", {'('}, {"\\sqrt{", 0, "}"} },
        n2l_abs { "abs", {'('}, {"\\left|", 0, "\\right|"} },
        n2l_diff { "diff", {'('}, {"\\frac{d}{d", 0, "}"} };
    expr = n2l_diff(n2l_abs(n2l_sqrt(expr)));
    return expr;
}